

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void __thiscall obx::Store::Store(Store *this,Store *source)

{
  this->_vptr_Store = (_func_int **)&PTR__Store_00112898;
  (this->cStore_)._M_b._M_p = (source->cStore_)._M_b._M_p;
  this->owned_ = source->owned_;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->syncClientMutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->syncClientMutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->syncClientMutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  LOCK();
  (source->cStore_)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  std::mutex::lock(&source->syncClientMutex_);
  std::__shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>,
             &(source->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&source->syncClientMutex_);
  return;
}

Assistant:

Store::Store(Store&& source) noexcept : cStore_(source.cStore_.load()), owned_(source.owned_) {
    source.cStore_ = nullptr;
    std::lock_guard<std::mutex> lock(source.syncClientMutex_);
    syncClient_ = std::move(source.syncClient_);
}